

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_write_format_iso9660_filename.c
# Opt level: O0

int create_iso_image(uchar *buff,size_t buffsize,size_t *used,char *opt)

{
  int iVar1;
  archive *_a;
  char local_458 [8];
  char sym255 [256];
  char sym128 [129];
  char local_2ca [8];
  char sym1 [2];
  char fname2 [256];
  char fname1 [256];
  int lens [33];
  int local_3c;
  int local_38;
  int fcnt;
  int l;
  int i;
  archive *a;
  char *opt_local;
  size_t *used_local;
  size_t buffsize_local;
  uchar *buff_local;
  
  memcpy(fname1 + 0xf8,&DAT_00357e80,0x84);
  _a = archive_write_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_filename.c"
                   ,L'Û',(uint)(_a != (archive *)0x0),"(a = archive_write_new()) != NULL",
                   (void *)0x0);
  iVar1 = archive_write_set_format_iso9660(_a);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_filename.c"
                   ,L'Ü',(uint)(iVar1 == 0),"0 == archive_write_set_format_iso9660(a)",_a);
  iVar1 = archive_write_add_filter_none(_a);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_filename.c"
                   ,L'Ý',(uint)(iVar1 == 0),"0 == archive_write_add_filter_none(a)",_a);
  iVar1 = archive_write_set_option(_a,(char *)0x0,"pad",(char *)0x0);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_filename.c"
                   ,L'Þ',(uint)(iVar1 == 0),"0 == archive_write_set_option(a, NULL, \"pad\", NULL)"
                   ,_a);
  if (opt != (char *)0x0) {
    iVar1 = archive_write_set_options(_a,opt);
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_filename.c"
                     ,L'à',(uint)(iVar1 == 0),"0 == archive_write_set_options(a, opt)",_a);
  }
  iVar1 = archive_write_set_bytes_per_block(_a,1);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_filename.c"
                   ,L'á',(uint)(iVar1 == 0),"0 == archive_write_set_bytes_per_block(a, 1)",_a);
  iVar1 = archive_write_set_bytes_in_last_block(_a,1);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_filename.c"
                   ,L'â',(uint)(iVar1 == 0),"0 == archive_write_set_bytes_in_last_block(a, 1)",_a);
  iVar1 = archive_write_open_memory(_a,buff,buffsize,used);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_filename.c"
                   ,L'ã',(uint)(iVar1 == 0),
                   "0 == archive_write_open_memory(a, buff, buffsize, used)",_a);
  local_2ca[0] = 'x';
  local_2ca[1] = 0;
  for (fcnt = 0; fcnt < 0x7f; fcnt = fcnt + 1) {
    sym255[(long)fcnt + 0xf8] = 'a';
  }
  for (fcnt = 0; fcnt < 0xfe; fcnt = fcnt + 1) {
    local_458[fcnt] = 'a';
  }
  sym255[0xf6] = 'x';
  sym255[0xf7] = '\0';
  local_3c = 0;
  fcnt = 0;
  while (-1 < lens[(long)fcnt + -2]) {
    for (local_38 = 0; local_38 < lens[(long)fcnt + -2]; local_38 = local_38 + 1) {
      fname2[(long)local_38 + 0xf8] = 'a';
      local_2ca[(long)local_38 + 2] = 'A';
    }
    if (0 < local_38) {
      fname2[(long)local_38 + 0xf8] = '\0';
      local_2ca[(long)local_38 + 2] = '\0';
      add_entry(_a,fname2 + 0xf8,(char *)0x0);
      add_entry(_a,local_2ca + 2,local_2ca);
      local_3c = local_3c + 2;
    }
    if (local_38 < 0xfe) {
      fname2[(long)local_38 + 0xf8] = '.';
      fname2[(long)(local_38 + 1) + 0xf8] = 'c';
      fname2[(long)(local_38 + 2) + 0xf8] = '\0';
      local_2ca[(long)local_38 + 2] = '.';
      local_2ca[(long)(local_38 + 1) + 2] = 'C';
      local_2ca[(long)(local_38 + 2) + 2] = '\0';
      add_entry(_a,fname2 + 0xf8,sym255 + 0xf8);
      add_entry(_a,local_2ca + 2,local_458);
      local_3c = local_3c + 2;
    }
    if (local_38 < 0xfc) {
      fname2[(long)local_38 + 0xf8] = '.';
      fname2[(long)(local_38 + 1) + 0xf8] = 'p';
      fname2[(long)(local_38 + 2) + 0xf8] = 'n';
      fname2[(long)(local_38 + 3) + 0xf8] = 'g';
      fname2[(long)(local_38 + 4) + 0xf8] = '\0';
      local_2ca[(long)local_38 + 2] = '.';
      local_2ca[(long)(local_38 + 1) + 2] = 'P';
      local_2ca[(long)(local_38 + 2) + 2] = 'N';
      local_2ca[(long)(local_38 + 3) + 2] = 'G';
      local_2ca[(long)(local_38 + 4) + 2] = '\0';
      add_entry(_a,fname2 + 0xf8,(char *)0x0);
      add_entry(_a,local_2ca + 2,local_2ca);
      local_3c = local_3c + 2;
    }
    if (local_38 < 0xfb) {
      fname2[(long)local_38 + 0xf8] = '.';
      fname2[(long)(local_38 + 1) + 0xf8] = 'j';
      fname2[(long)(local_38 + 2) + 0xf8] = 'p';
      fname2[(long)(local_38 + 3) + 0xf8] = 'e';
      fname2[(long)(local_38 + 4) + 0xf8] = 'g';
      fname2[(long)(local_38 + 5) + 0xf8] = '\0';
      local_2ca[(long)local_38 + 2] = '.';
      local_2ca[(long)(local_38 + 1) + 2] = 'J';
      local_2ca[(long)(local_38 + 2) + 2] = 'P';
      local_2ca[(long)(local_38 + 3) + 2] = 'E';
      local_2ca[(long)(local_38 + 4) + 2] = 'G';
      local_2ca[(long)(local_38 + 5) + 2] = '\0';
      add_entry(_a,fname2 + 0xf8,sym255 + 0xf8);
      add_entry(_a,local_2ca + 2,local_458);
      local_3c = local_3c + 2;
    }
    fcnt = fcnt + 1;
  }
  iVar1 = archive_write_close(_a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_filename.c"
                      ,L'ī',0,"ARCHIVE_OK",(long)iVar1,"archive_write_close(a)",_a);
  iVar1 = archive_write_free(_a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_filename.c"
                      ,L'Ĭ',0,"ARCHIVE_OK",(long)iVar1,"archive_write_free(a)",_a);
  return local_3c;
}

Assistant:

static int
create_iso_image(unsigned char *buff, size_t buffsize, size_t *used,
    const char *opt)
{
	struct archive *a;
	int i, l, fcnt;
	const int lens[] = {
	    0, 1, 3, 5, 7, 8, 9, 29, 30, 31, 32,
		62, 63, 64, 65, 101, 102, 103, 104,
	    191, 192, 193, 194, 204, 205, 206, 207, 208,
		252, 253, 254, 255,
	    -1 };
	char fname1[256];
	char fname2[256];
	char sym1[2];
	char sym128[129];
	char sym255[256];

	/* ISO9660 format: Create a new archive in memory. */
	assert((a = archive_write_new()) != NULL);
	assertA(0 == archive_write_set_format_iso9660(a));
	assertA(0 == archive_write_add_filter_none(a));
	assertA(0 == archive_write_set_option(a, NULL, "pad", NULL));
	if (opt)
		assertA(0 == archive_write_set_options(a, opt));
	assertA(0 == archive_write_set_bytes_per_block(a, 1));
	assertA(0 == archive_write_set_bytes_in_last_block(a, 1));
	assertA(0 == archive_write_open_memory(a, buff, buffsize, used));

	sym1[0] = 'x';
	sym1[1] = '\0';
	for (i = 0; i < (int)sizeof(sym128)-2; i++)
		sym128[i] = 'a';
	sym128[sizeof(sym128)-2] = 'x';
	sym128[sizeof(sym128)-1] = '\0';
	for (i = 0; i < (int)sizeof(sym255)-2; i++)
		sym255[i] = 'a';
	sym255[sizeof(sym255)-2] = 'x';
	sym255[sizeof(sym255)-1] = '\0';

	fcnt = 0;
	for (i = 0; lens[i] >= 0; i++) {
		for (l = 0; l < lens[i]; l++) {
			fname1[l] = 'a';
			fname2[l] = 'A';
		}
		if (l > 0) {
			fname1[l] = '\0';
			fname2[l] = '\0';
			add_entry(a, fname1, NULL);
			add_entry(a, fname2, sym1);
			fcnt += 2;
		}
		if (l < 254) {
			fname1[l] = '.';
			fname1[l+1] = 'c';
			fname1[l+2] = '\0';
			fname2[l] = '.';
			fname2[l+1] = 'C';
			fname2[l+2] = '\0';
			add_entry(a, fname1, sym128);
			add_entry(a, fname2, sym255);
			fcnt += 2;
		}
		if (l < 252) {
			fname1[l] = '.';
			fname1[l+1] = 'p';
			fname1[l+2] = 'n';
			fname1[l+3] = 'g';
			fname1[l+4] = '\0';
			fname2[l] = '.';
			fname2[l+1] = 'P';
			fname2[l+2] = 'N';
			fname2[l+3] = 'G';
			fname2[l+4] = '\0';
			add_entry(a, fname1, NULL);
			add_entry(a, fname2, sym1);
			fcnt += 2;
		}
		if (l < 251) {
			fname1[l] = '.';
			fname1[l+1] = 'j';
			fname1[l+2] = 'p';
			fname1[l+3] = 'e';
			fname1[l+4] = 'g';
			fname1[l+5] = '\0';
			fname2[l] = '.';
			fname2[l+1] = 'J';
			fname2[l+2] = 'P';
			fname2[l+3] = 'E';
			fname2[l+4] = 'G';
			fname2[l+5] = '\0';
			add_entry(a, fname1, sym128);
			add_entry(a, fname2, sym255);
			fcnt += 2;
		}
	}

	/* Close out the archive. */
	assertEqualIntA(a, ARCHIVE_OK, archive_write_close(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_write_free(a));

	return (fcnt);
}